

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall cmQtAutoGenerator::Logger::Info(Logger *this,GenT genType,string_view message)

{
  string_view str;
  bool bVar1;
  lock_guard<std::mutex> local_80;
  lock_guard<std::mutex> lock;
  char *local_60;
  string_view local_58;
  undefined1 local_48 [8];
  string msg;
  GenT genType_local;
  Logger *this_local;
  string_view message_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (Logger *)message._M_len;
  msg.field_2._12_4_ = genType;
  local_58 = cmQtAutoGen::GeneratorName(genType);
  lock._M_device = &this_local->Mutex_;
  str._M_str = (char *)message_local._M_len;
  str._M_len = (size_t)this_local;
  bVar1 = cmHasSuffix(str,'\n');
  local_60 = "\n";
  if (bVar1) {
    local_60 = "";
  }
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char_const(&)[3],std::basic_string_view<char,std::char_traits<char>>&,char_const*>
            ((string *)local_48,&local_58,(char (*) [3])0x1016dd2,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_60);
  std::lock_guard<std::mutex>::lock_guard(&local_80,&this->Mutex_);
  cmSystemTools::Stdout((string *)local_48);
  std::lock_guard<std::mutex>::~lock_guard(&local_80);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::Info(GenT genType,
                                     cm::string_view message) const
{
  std::string msg = cmStrCat(GeneratorName(genType), ": ", message,
                             cmHasSuffix(message, '\n') ? "" : "\n");
  {
    std::lock_guard<std::mutex> lock(this->Mutex_);
    cmSystemTools::Stdout(msg);
  }
}